

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O1

int ecx_send_processdata_group(ecx_contextt *context,uint8 group)

{
  byte bVar1;
  ec_idxstackT *peVar2;
  uint uVar3;
  int iVar4;
  uint8 uVar5;
  ulong uVar6;
  ulong uVar7;
  ec_groupt *peVar8;
  uint32 uVar9;
  undefined7 in_register_00000031;
  uint32 uVar10;
  int iVar11;
  uint16 uVar12;
  uint8 *data;
  uint32 uVar13;
  void *data_00;
  long lVar14;
  uint uVar15;
  bool bVar16;
  uint16 length;
  uint8 *local_68;
  
  peVar8 = context->grouplist;
  uVar6 = CONCAT71(in_register_00000031,group) & 0xffffffff;
  bVar16 = peVar8[uVar6].hasdc == '\0';
  uVar13 = peVar8[uVar6].Obytes;
  uVar10 = peVar8[uVar6].Ibytes;
  iVar11 = uVar10 + uVar13;
  if (iVar11 == 0) {
    iVar4 = 0;
  }
  else {
    uVar9 = peVar8[uVar6].logstartaddr;
    if (group == '\0') {
      peVar2 = context->idxstack;
      peVar2->pushed = '\0';
      peVar2->pulled = '\0';
    }
    if (peVar8[uVar6].blockLRW == '\0') {
      data_00 = *(void **)(peVar8[uVar6].IOsegment + (ulong)(uVar13 == 0) * 4 + -0xb);
      lVar14 = 0;
      do {
        uVar13 = context->grouplist[uVar6].IOsegment[lVar14];
        uVar3 = ecx_getindex(context->port);
        uVar15 = uVar3 & 0xff;
        uVar12 = (uint16)uVar13;
        uVar5 = (uint8)uVar3;
        ecx_setupdatagram(context->port,context->port->txbuf + uVar15,'\f',uVar5,(uint16)uVar9,
                          (uint16)(uVar9 >> 0x10),uVar12,data_00);
        if (!bVar16) {
          context->DCl = uVar12;
          iVar4 = ecx_adddatagram(context->port,context->port->txbuf + uVar15,'\x0e',uVar5,'\0',
                                  context->slavelist[context->grouplist[uVar6].DCnext].configadr,
                                  0x910,8,context->DCtime);
          context->DCtO = (uint16)iVar4;
        }
        ecx_outframe_red(context->port,uVar15);
        uVar7 = (ulong)context->idxstack->pushed;
        if (uVar7 < 0x10) {
          context->idxstack->idx[uVar7] = uVar5;
          context->idxstack->data[context->idxstack->pushed] = data_00;
          peVar2 = context->idxstack;
          bVar1 = peVar2->pushed;
          peVar2->length[bVar1] = uVar12;
          peVar2->pushed = bVar1 + 1;
        }
        iVar4 = 1;
        iVar11 = iVar11 - uVar13;
        if (iVar11 == 0) {
          return 1;
        }
        data_00 = (void *)((long)data_00 + (long)(int)uVar13);
        uVar9 = uVar9 + uVar13;
        lVar14 = lVar14 + 1;
        bVar16 = true;
      } while ((ushort)lVar14 < context->grouplist[uVar6].nsegments);
    }
    else {
      if (uVar10 != 0) {
        uVar12 = peVar8[uVar6].Isegment;
        local_68 = peVar8[uVar6].inputs;
        iVar11 = uVar9 + uVar13;
        do {
          peVar8 = context->grouplist;
          uVar13 = peVar8[uVar6].IOsegment[uVar12];
          if (uVar12 == peVar8[uVar6].Isegment) {
            uVar13 = uVar13 - peVar8[uVar6].Ioffset;
          }
          uVar3 = ecx_getindex(context->port);
          uVar15 = uVar3 & 0xff;
          length = (uint16)uVar13;
          uVar5 = (uint8)uVar3;
          ecx_setupdatagram(context->port,context->port->txbuf + uVar15,'\n',uVar5,(uint16)iVar11,
                            (uint16)((uint)iVar11 >> 0x10),length,local_68);
          if (!bVar16) {
            context->DCl = length;
            iVar4 = ecx_adddatagram(context->port,context->port->txbuf + uVar15,'\x0e',uVar5,'\0',
                                    context->slavelist[context->grouplist[uVar6].DCnext].configadr,
                                    0x910,8,context->DCtime);
            context->DCtO = (uint16)iVar4;
          }
          ecx_outframe_red(context->port,uVar15);
          uVar7 = (ulong)context->idxstack->pushed;
          if (uVar7 < 0x10) {
            context->idxstack->idx[uVar7] = uVar5;
            context->idxstack->data[context->idxstack->pushed] = local_68;
            peVar2 = context->idxstack;
            bVar1 = peVar2->pushed;
            peVar2->length[bVar1] = length;
            peVar2->pushed = bVar1 + 1;
          }
          uVar10 = uVar10 - uVar13;
          if (uVar10 == 0) {
            bVar16 = true;
            break;
          }
          uVar12 = uVar12 + 1;
          local_68 = local_68 + (int)uVar13;
          iVar11 = iVar11 + uVar13;
          bVar16 = true;
        } while (uVar12 < context->grouplist[uVar6].nsegments);
      }
      uVar13 = context->grouplist[uVar6].Obytes;
      iVar4 = 1;
      if (uVar13 != 0) {
        peVar8 = context->grouplist + uVar6;
        data = peVar8->outputs;
        uVar10 = peVar8->logstartaddr;
        lVar14 = 0;
        do {
          uVar9 = context->grouplist[uVar6].IOsegment[lVar14];
          if ((int)uVar13 < (int)uVar9) {
            uVar9 = uVar13;
          }
          uVar3 = ecx_getindex(context->port);
          uVar15 = uVar3 & 0xff;
          uVar12 = (uint16)uVar9;
          uVar5 = (uint8)uVar3;
          ecx_setupdatagram(context->port,context->port->txbuf + uVar15,'\v',uVar5,(uint16)uVar10,
                            (uint16)(uVar10 >> 0x10),uVar12,data);
          if (!bVar16) {
            context->DCl = uVar12;
            iVar11 = ecx_adddatagram(context->port,context->port->txbuf + uVar15,'\x0e',uVar5,'\0',
                                     context->slavelist[context->grouplist[uVar6].DCnext].configadr,
                                     0x910,8,context->DCtime);
            context->DCtO = (uint16)iVar11;
          }
          ecx_outframe_red(context->port,uVar15);
          uVar7 = (ulong)context->idxstack->pushed;
          if (uVar7 < 0x10) {
            context->idxstack->idx[uVar7] = uVar5;
            context->idxstack->data[context->idxstack->pushed] = data;
            peVar2 = context->idxstack;
            bVar1 = peVar2->pushed;
            peVar2->length[bVar1] = uVar12;
            peVar2->pushed = bVar1 + 1;
          }
          uVar13 = uVar13 - uVar9;
          if (uVar13 == 0) break;
          data = data + (int)uVar9;
          uVar10 = uVar10 + uVar9;
          lVar14 = lVar14 + 1;
          bVar16 = true;
        } while ((ushort)lVar14 < context->grouplist[uVar6].nsegments);
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int ecx_send_processdata_group(ecx_contextt *context, uint8 group)
{
   uint32 LogAdr;
   uint16 w1, w2;
   int length, sublength;
   uint8 idx;
   int wkc;
   uint8* data;
   boolean first=FALSE;
   uint16 currentsegment = 0;

   wkc = 0;
   if(context->grouplist[group].hasdc)
   {
      first = TRUE;
   }
   length = context->grouplist[group].Obytes + context->grouplist[group].Ibytes;
   LogAdr = context->grouplist[group].logstartaddr;
   if (length)
   {
      if(!group)
      {
         context->idxstack->pushed = 0;
         context->idxstack->pulled = 0;
      }
      wkc = 1;
      /* LRW blocked by one or more slaves ? */
      if (context->grouplist[group].blockLRW)
      {
         /* if inputs available generate LRD */
         if(context->grouplist[group].Ibytes)
         {
            currentsegment = context->grouplist[group].Isegment;
            data = context->grouplist[group].inputs;
            length = context->grouplist[group].Ibytes;
            LogAdr += context->grouplist[group].Obytes;
            /* segment transfer if needed */
            do
            {
               if(currentsegment == context->grouplist[group].Isegment)
               {
                  sublength = context->grouplist[group].IOsegment[currentsegment++] - context->grouplist[group].Ioffset;
               }
               else
               {
                  sublength = context->grouplist[group].IOsegment[currentsegment++];
               }
               /* get new index */
               idx = ecx_getindex(context->port);
               w1 = LO_WORD(LogAdr);
               w2 = HI_WORD(LogAdr);
               ecx_setupdatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_LRD, idx, w1, w2, sublength, data);
               if(first)
               {
                  context->DCl = sublength;
                  /* FPRMW in second datagram */
                  context->DCtO = ecx_adddatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_FRMW, idx, FALSE,
                                           context->slavelist[context->grouplist[group].DCnext].configadr,
                                           ECT_REG_DCSYSTIME, sizeof(context->DCtime), context->DCtime);
                  first = FALSE;
               }
               /* send frame */
               ecx_outframe_red(context->port, idx);
               /* push index and data pointer on stack */
               ecx_pushindex(context, idx, data, sublength);
               length -= sublength;
               LogAdr += sublength;
               data += sublength;
            } while (length && (currentsegment < context->grouplist[group].nsegments));
         }
         /* if outputs available generate LWR */
         if(context->grouplist[group].Obytes)
         {
            data = context->grouplist[group].outputs;
            length = context->grouplist[group].Obytes;
            LogAdr = context->grouplist[group].logstartaddr;
            currentsegment = 0;
            /* segment transfer if needed */
            do
            {
               sublength = context->grouplist[group].IOsegment[currentsegment++];
               if((length - sublength) < 0)
               {
                  sublength = length;
               }
               /* get new index */
               idx = ecx_getindex(context->port);
               w1 = LO_WORD(LogAdr);
               w2 = HI_WORD(LogAdr);
               ecx_setupdatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_LWR, idx, w1, w2, sublength, data);
               if(first)
               {
                  context->DCl = sublength;
                  /* FPRMW in second datagram */
                  context->DCtO = ecx_adddatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_FRMW, idx, FALSE,
                                           context->slavelist[context->grouplist[group].DCnext].configadr,
                                           ECT_REG_DCSYSTIME, sizeof(context->DCtime), context->DCtime);
                  first = FALSE;
               }
               /* send frame */
               ecx_outframe_red(context->port, idx);
               /* push index and data pointer on stack */
               ecx_pushindex(context, idx, data, sublength);
               length -= sublength;
               LogAdr += sublength;
               data += sublength;
            } while (length && (currentsegment < context->grouplist[group].nsegments));
         }
      }
      /* LRW can be used */
      else
      {
         if (context->grouplist[group].Obytes)
         {
            data = context->grouplist[group].outputs;
         }
         else
         {
            data = context->grouplist[group].inputs;
         }
         /* segment transfer if needed */
         do
         {
            sublength = context->grouplist[group].IOsegment[currentsegment++];
            /* get new index */
            idx = ecx_getindex(context->port);
            w1 = LO_WORD(LogAdr);
            w2 = HI_WORD(LogAdr);
            ecx_setupdatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_LRW, idx, w1, w2, sublength, data);
            if(first)
            {
               context->DCl = sublength;
               /* FPRMW in second datagram */
               context->DCtO = ecx_adddatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_FRMW, idx, FALSE,
                                        context->slavelist[context->grouplist[group].DCnext].configadr,
                                        ECT_REG_DCSYSTIME, sizeof(context->DCtime), context->DCtime);
               first = FALSE;
            }
            /* send frame */
            ecx_outframe_red(context->port, idx);
            /* push index and data pointer on stack */
            ecx_pushindex(context, idx, data, sublength);
            length -= sublength;
            LogAdr += sublength;
            data += sublength;
         } while (length && (currentsegment < context->grouplist[group].nsegments));
      }
   }

   return wkc;
}